

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall cs::instance_type::compile(instance_type *this,string *path)

{
  char cVar1;
  fatal_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_238;
  ifstream in;
  
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->file_path);
  std::ifstream::ifstream(&in,(string *)path,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    compile(this,(istream *)&in);
    std::ifstream::~ifstream(&in);
    return;
  }
  this_00 = (fatal_error *)__cxa_allocate_exception(0x28);
  std::operator+(&bStack_238,path,": No such file or directory");
  fatal_error::fatal_error(this_00,&bStack_238);
  __cxa_throw(this_00,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void instance_type::compile(const std::string &path)
	{
		// Read from file
		context->file_path = path;
		std::ifstream in(path, std::ios::binary);
		if (!in.is_open())
			throw fatal_error(path + ": No such file or directory");
		compile(in);
	}